

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void ts_parser__recover(TSParser *self,StackVersion version,Subtree lookahead)

{
  undefined4 uVar1;
  undefined4 uVar2;
  StackHead *pSVar3;
  SubtreeHeapData *pSVar4;
  Subtree self_00;
  TSLanguage *self_01;
  uint cost;
  StackSliceArray SVar5;
  TSParseAction *pTVar6;
  _Bool _Var7;
  uint8_t uVar8;
  TSSymbol TVar9;
  ushort uVar10;
  uint uVar11;
  undefined4 extraout_var;
  MutableSubtree MVar12;
  StackSlice *pSVar13;
  MutableSubtree MVar14;
  Subtree *pSVar15;
  Subtree SVar16;
  uint uVar17;
  ulong uVar18;
  MutableSubtree *pMVar19;
  char *pcVar20;
  uint8_t uVar21;
  byte bVar22;
  MutableSubtree pool;
  TSStateId state;
  uint i;
  uint uVar23;
  TSParser *pTVar24;
  uint32_t uVar25;
  int iVar26;
  StackSlice *pSVar27;
  TSParser *pTVar28;
  ulong uVar29;
  Stack *pSVar30;
  long lVar31;
  TSParser *pTVar32;
  ulong uVar33;
  TSParser *pTVar34;
  uint j;
  StackVersion SVar35;
  bool pending;
  Length LVar36;
  StackSliceArray SVar37;
  SubtreeArray SVar38;
  TableEntry entry;
  char *contents;
  Length result;
  Length result_1;
  TableEntry TStack_168;
  MutableSubtree MStack_158;
  StackSlice *pSStack_150;
  TSParser *pTStack_148;
  TSParser *pTStack_140;
  MutableSubtree MStack_138;
  TSParser *pTStack_130;
  uint local_124;
  Subtree local_120;
  TSParser *local_118;
  TSParser *local_110;
  TableEntry local_108;
  ulong local_f8;
  uint local_ec;
  MutableSubtree local_e8;
  SubtreePool *local_e0;
  ulong local_d8;
  uint32_t local_cc;
  uint local_c8;
  uint local_c4;
  int local_c0;
  uint local_bc;
  StackSlice *local_b8;
  SubtreeArray local_b0;
  undefined8 local_a0;
  ulong local_98;
  StackSlice *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  
  pTVar34 = (TSParser *)(ulong)version;
  pTVar24 = (TSParser *)(ulong)(self->stack->heads).size;
  pTStack_130 = (TSParser *)0x137c57;
  LVar36 = ts_stack_position(self->stack,version);
  local_d8 = LVar36._0_8_;
  pSVar30 = self->stack;
  if ((pSVar30->heads).size <= version) {
    pTStack_130 = (TSParser *)0x1386b2;
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x240,"StackSummary *ts_stack_get_summary(Stack *, StackVersion)");
  }
  MVar12.ptr = (SubtreeHeapData *)((long)pTVar34 * 5);
  pSVar13 = (StackSlice *)(pSVar30->heads).contents[(long)pTVar34].summary;
  pTStack_130 = (TSParser *)0x137c84;
  local_ec = ts_stack_node_count_since_error(pSVar30,version);
  pTStack_130 = (TSParser *)0x137c97;
  uVar11 = ts_stack_error_cost(self->stack,version);
  local_a0 = CONCAT44(extraout_var,uVar11);
  local_124 = version;
  local_120 = lookahead;
  local_110 = self;
  if ((pSVar13 == (StackSlice *)0x0) ||
     (((((ulong)lookahead.ptr & 1) == 0 && ((lookahead.ptr)->symbol == 0xffff)) ||
      ((pSVar13->subtrees).size == 0)))) {
    bVar22 = 0;
  }
  else {
    local_c8 = (uint)(local_ec != 0);
    local_98 = local_d8 >> 0x20;
    local_c0 = uVar11 + (int)local_d8;
    local_c4 = (uint)lookahead.data.symbol;
    local_e0 = &self->tree_pool;
    uVar18 = 0;
    local_118 = pTVar24;
    local_e8.ptr = MVar12.ptr;
    local_90 = pSVar13;
    do {
      pSVar15 = (local_90->subtrees).contents;
      uVar10 = *(ushort *)((long)pSVar15 + uVar18 * 0x14 + 0x10);
      uVar11 = (uint)uVar10;
      local_88 = uVar18;
      if (uVar10 != 0) {
        uVar25 = (((StackSummaryEntry *)((long)pSVar15 + uVar18 * 0x14))->position).bytes;
        if (uVar25 != (uint32_t)local_d8) {
          iVar26 = *(int *)((long)pSVar15 + uVar18 * 0x14 + 4);
          uVar23 = *(uint *)((long)pSVar15 + uVar18 * 0x14 + 0xc);
          if ((int)local_118 != 0) {
            pTVar24 = (TSParser *)0x0;
            do {
              pSVar30 = self->stack;
              if ((TSParser *)(ulong)(pSVar30->heads).size <= pTVar24) goto LAB_00138655;
              if (((pSVar30->heads).contents[(long)pTVar24].node)->state == uVar10) {
                pTStack_130 = (TSParser *)0x137d8b;
                LVar36 = ts_stack_position(pSVar30,(StackVersion)pTVar24);
                if (LVar36.bytes == (uint32_t)local_d8) goto LAB_00138086;
              }
              pTVar24 = (TSParser *)((long)&(pTVar24->lexer).data.lookahead + 1);
            } while (pTVar24 != local_118);
          }
          uVar17 = local_124;
          cost = ((int)local_98 - iVar26) * 0x1e;
          pTStack_130 = (TSParser *)0x137dd1;
          _Var7 = ts_parser__better_version_exists
                            (self,local_124,
                             (_Bool)(((char)local_c0 - (char)uVar25) + (char)uVar23 * 'd' +
                                    (char)cost),cost);
          if (_Var7) {
            bVar22 = 0;
            pSVar13 = (StackSlice *)(ulong)uVar23;
            MVar12 = local_e8;
            goto LAB_001380bb;
          }
          TVar9 = (TSSymbol)local_c4;
          if (((ulong)local_120.ptr & 1) == 0) {
            TVar9 = (local_120.ptr)->symbol;
          }
          pTStack_130 = (TSParser *)0x137e01;
          ts_language_table_entry(self->language,uVar10,TVar9,&local_108);
          if (local_108.action_count != 0) {
            local_cc = uVar23 + local_c8;
            pTStack_130 = (TSParser *)0x137e27;
            SVar37 = ts_stack_pop_count(self->stack,local_124,local_cc);
            if (SVar37.size != 0) {
              uVar18 = 0;
              SVar35 = 0xffffffff;
              local_bc = (uint)uVar10;
              SVar5 = SVar37;
              do {
                local_b8 = SVar5.contents;
                pSVar13 = SVar37.contents;
                local_f8 = *(ulong *)&pSVar13[uVar18].version;
                local_108.actions = (TSParseAction *)pSVar13[uVar18].subtrees.contents;
                local_108._8_8_ = *(undefined8 *)&pSVar13[uVar18].subtrees.size;
                uVar17 = (uint)local_f8;
                uVar23 = (uint)uVar18;
                if (uVar17 == SVar35) {
                  pTStack_130 = (TSParser *)0x137e80;
                  ts_subtree_array_delete(local_e0,(SubtreeArray *)&local_108);
                  pSVar27 = pSVar13 + (uVar23 + 1);
                  uVar11 = local_bc;
LAB_00137fe4:
                  pTStack_130 = (TSParser *)0x137ff9;
                  memmove(pSVar13 + uVar18,pSVar27,(ulong)(SVar5.size + ~uVar23) * 0x18);
                  uVar29 = SVar37._8_8_ + 0xffffffff;
                }
                else {
                  pSVar30 = local_110->stack;
                  if ((pSVar30->heads).size <= uVar17) {
LAB_00138655:
                    pTStack_130 = (TSParser *)0x138674;
                    __assert_fail("(uint32_t)version < (&self->heads)->size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                  ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
                  }
                  pSVar3 = (pSVar30->heads).contents;
                  state = (TSStateId)uVar11;
                  if ((pSVar3[local_f8 & 0xffffffff].node)->state != state) {
                    pSVar3[local_f8 & 0xffffffff].status = StackStatusHalted;
                    pTStack_130 = (TSParser *)0x137fcf;
                    ts_subtree_array_delete(local_e0,(SubtreeArray *)&local_108);
                    pSVar27 = local_b8 + (uVar23 + 1);
                    pSVar13 = local_b8;
                    goto LAB_00137fe4;
                  }
                  pTStack_130 = (TSParser *)0x137ed6;
                  local_b0 = ts_stack_pop_error(pSVar30,uVar17);
                  if (local_b0.size != 0) {
                    if (local_b0.size != 1) {
                      pTStack_130 = (TSParser *)0x138693;
                      __assert_fail("error_trees.size == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                                    ,0x40e,
                                    "_Bool ts_parser__recover_to_state(TSParser *, StackVersion, unsigned int, TSStateId)"
                                   );
                    }
                    pSVar4 = (local_b0.contents)->ptr;
                    if (((ulong)pSVar4 & 1) == 0) {
                      uVar23 = pSVar4->child_count;
                      if ((ulong)uVar23 != 0) {
                        pTStack_130 = (TSParser *)0x137f1d;
                        array__splice((VoidArray *)&local_108,8,0,0,uVar23,
                                      (pSVar4->field_17).field_0.children);
                        pTVar6 = local_108.actions;
                        uVar29 = 0;
                        do {
                          pTStack_130 = (TSParser *)0x137f2e;
                          ts_subtree_retain(*(Subtree *)(pTVar6 + uVar29));
                          uVar29 = uVar29 + 1;
                        } while (uVar23 != uVar29);
                      }
                    }
                    pTStack_130 = (TSParser *)0x137f45;
                    ts_subtree_array_delete(local_e0,&local_b0);
                  }
                  pTStack_130 = (TSParser *)0x137f5d;
                  local_80 = SVar37._8_8_;
                  SVar38 = ts_subtree_array_remove_trailing_extras((SubtreeArray *)&local_108);
                  pTVar24 = local_110;
                  local_78 = uVar18;
                  if (local_108.action_count == 0) {
                    pTStack_130 = (TSParser *)0x13800d;
                    free(local_108.actions);
                    local_108.actions = (TSParseAction *)0x0;
                    local_108.action_count = 0;
                    local_108.is_reusable = false;
                    local_108._13_3_ = 0;
                    SVar35 = (StackVersion)local_f8;
                  }
                  else {
                    pTStack_130 = (TSParser *)0x137f96;
                    MVar12 = ts_subtree_new_node(local_e0,0xffff,(SubtreeArray *)&local_108,0,
                                                 local_110->language);
                    (MVar12.ptr)->field_0x2c = (MVar12.ptr)->field_0x2c | 4;
                    SVar35 = (StackVersion)local_f8;
                    pTStack_130 = (TSParser *)0x137fb6;
                    ts_stack_push(pTVar24->stack,(StackVersion)local_f8,(Subtree)MVar12,false,state)
                    ;
                  }
                  pTVar24 = local_110;
                  if (((undefined1  [16])SVar38 & (undefined1  [16])0xffffffff) !=
                      (undefined1  [16])0x0) {
                    uVar18 = 0;
                    do {
                      pTStack_130 = (TSParser *)0x138043;
                      ts_stack_push(pTVar24->stack,SVar35,SVar38.contents[uVar18],false,state);
                      uVar18 = uVar18 + 1;
                    } while ((SVar38._8_8_ & 0xffffffff) != uVar18);
                  }
                  pTStack_130 = (TSParser *)0x138053;
                  free(SVar38.contents);
                  uVar18 = (ulong)((int)local_78 + 1);
                  uVar29 = local_80;
                }
                self = local_110;
                pSVar13 = (StackSlice *)(uVar29 & 0xffffffff);
                SVar5._8_8_ = pSVar13;
                SVar5.contents = local_b8;
                SVar37.size = (int)uVar29;
                SVar37.capacity = (int)(uVar29 >> 0x20);
                SVar37.contents = local_b8;
              } while ((uint)uVar18 < (uint)uVar29);
              if (SVar35 != 0xffffffff) {
                if (((local_110->lexer).logger.log == (_func_void_void_ptr_TSLogType_char_ptr *)0x0)
                   && (local_110->dot_graph_file == (FILE *)0x0)) {
                  bVar22 = 1;
                  MVar12 = local_e8;
                  uVar17 = local_124;
                }
                else {
                  pTStack_130 = (TSParser *)0x138551;
                  snprintf((local_110->lexer).debug_buffer,0x400,
                           "recover_to_previous state:%u, depth:%u",(ulong)uVar11,(ulong)local_cc);
                  pTStack_130 = (TSParser *)0x138559;
                  ts_parser__log(self);
                  MVar12 = local_e8;
                  bVar22 = 1;
                  uVar17 = local_124;
                  if (self->dot_graph_file != (FILE *)0x0) {
                    pTStack_130 = (TSParser *)0x13857f;
                    ts_stack_print_dot_graph(self->stack,self->language,self->dot_graph_file);
                    pTStack_130 = (TSParser *)0x138592;
                    fputs("\n\n",(FILE *)self->dot_graph_file);
                    uVar17 = local_124;
                  }
                }
                goto LAB_001380bb;
              }
            }
          }
        }
      }
LAB_00138086:
      uVar18 = local_88 + 1;
    } while (uVar18 < (local_90->subtrees).size);
    bVar22 = 0;
    pSVar13 = local_90;
    MVar12 = local_e8;
    uVar17 = local_124;
LAB_001380bb:
    pTVar34 = (TSParser *)(ulong)uVar17;
    pTVar24 = local_118;
  }
  pSVar30 = self->stack;
  while( true ) {
    SVar16 = local_120;
    uVar11 = (pSVar30->heads).size;
    uVar23 = (uint)pTVar24;
    if (uVar11 <= uVar23) break;
    if ((pSVar30->heads).contents[(ulong)pTVar24 & 0xffffffff].status != StackStatusActive) {
      pTVar24 = (TSParser *)(ulong)(uVar23 - 1);
      pTStack_130 = (TSParser *)0x1380e8;
      ts_stack_remove_version(pSVar30,uVar23);
      pSVar30 = self->stack;
    }
    pTVar24 = (TSParser *)(ulong)((int)pTVar24 + 1);
  }
  uVar23 = (uint)pTVar34;
  if ((bool)(bVar22 & 6 < uVar11)) {
    if (uVar11 <= uVar23) {
LAB_001386b2:
      pTStack_130 = (TSParser *)0x1386d1;
      __assert_fail("(uint32_t)version < (&self->heads)->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                    ,0x29d,"void ts_stack_halt(Stack *, StackVersion)");
    }
    (&((pSVar30->heads).contents)->status)[(long)MVar12.ptr * 2] = StackStatusHalted;
LAB_001382d2:
    ts_subtree_release(&self->tree_pool,SVar16);
    return;
  }
  if (((ulong)local_120.ptr & 1) == 0) {
    if ((local_120.ptr)->symbol == 0) goto LAB_001381c6;
    uVar1 = ((Length *)((long)local_120 + 4))->bytes;
    uVar8 = (uint8_t)uVar1;
    uVar2 = ((Length *)((long)local_120 + 0x10))->bytes;
    uVar21 = (uint8_t)uVar2;
  }
  else {
    if (((ulong)local_120.ptr & 0xff00) == 0) {
LAB_001381c6:
      if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
         (self->dot_graph_file != (FILE *)0x0)) {
        builtin_strncpy((self->lexer).debug_buffer,"recover_eof",0xc);
        pTStack_130 = (TSParser *)0x1381fe;
        ts_parser__log(self);
      }
      local_108.actions = (TSParseAction *)0x0;
      local_108.action_count = 0;
      local_108.is_reusable = false;
      local_108._13_3_ = 0;
      pTStack_130 = (TSParser *)0x138223;
      MVar12 = ts_subtree_new_node(&self->tree_pool,0xffff,(SubtreeArray *)&local_108,0,
                                   self->language);
      (MVar12.ptr)->field_0x2c = (MVar12.ptr)->field_0x2c & 0xfb;
      pTStack_130 = (TSParser *)0x138241;
      ts_stack_push(self->stack,uVar23,(Subtree)MVar12,false,1);
      pTStack_130 = (TSParser *)0x13824f;
      ts_parser__accept(self,uVar23,SVar16);
      return;
    }
    uVar8 = local_120.data.padding_bytes;
    uVar21 = local_120.data.size_bytes;
  }
  if (((ulong)local_120.ptr & 1) == 0) {
    pMVar19 = *(MutableSubtree **)&(local_120.ptr)->padding;
    uVar18._0_4_ = ((Length *)((long)local_120 + 0x10))->bytes;
    uVar18._4_4_ = (((Length *)((long)local_120 + 0x10))->extent).row;
    uVar29 = uVar18 & 0xffffffff00000000;
    uVar25 = ((local_120.ptr)->size).extent.column;
  }
  else {
    pMVar19 = (MutableSubtree *)
              ((ulong)local_120.ptr >> 8 & 0xf00000000 | (ulong)(local_120._2_4_ & 0xff));
    uVar18 = (ulong)local_120.ptr >> 0x18 & 0xff;
    uVar29 = 0;
    uVar25 = (uint32_t)uVar18;
  }
  local_b0.size = uVar25;
  local_b0.contents = (Subtree *)(uVar18 & 0xffffffff | uVar29);
  SVar38 = local_b0;
  local_b0.contents._4_4_ = (int)(uVar29 >> 0x20);
  local_108.actions._4_4_ = (int)((ulong)pMVar19 >> 0x20);
  iVar26 = local_108.actions._4_4_ + local_b0.contents._4_4_;
  pTStack_130 = (TSParser *)0x1382a4;
  local_108.actions = (TSParseAction *)pMVar19;
  local_b0 = SVar38;
  _Var7 = ts_parser__better_version_exists
                    (self,uVar23,
                     (_Bool)((char)local_a0 + uVar8 + uVar21 + 'd' + (char)iVar26 * '\x1e'),
                     iVar26 * 2);
  if (_Var7) {
    if ((self->stack->heads).size <= uVar23) goto LAB_001386b2;
    (&((self->stack->heads).contents)->status)[(long)MVar12.ptr * 2] = StackStatusHalted;
    goto LAB_001382d2;
  }
  if (((ulong)SVar16.ptr & 1) == 0) {
    TVar9 = (SVar16.ptr)->symbol;
  }
  else {
    TVar9 = (TSSymbol)SVar16.data.symbol;
  }
  pTStack_130 = (TSParser *)0x138312;
  ts_language_table_entry(self->language,1,TVar9,&local_108);
  MVar14.data = local_120.data;
  if (((local_108.action_count != 0) &&
      ((*(byte *)((long)local_108.actions + (ulong)(local_108.action_count - 1) * 8 + 6) & 0xf) == 0
      )) && ((*(byte *)((long)local_108.actions + (ulong)(local_108.action_count - 1) * 8 + 2) & 1)
             != 0)) {
    pTStack_130 = (TSParser *)0x138487;
    MVar14 = ts_subtree_make_mut(&self->tree_pool,local_120);
    if (((ulong)MVar14.ptr & 1) == 0) {
      (MVar14.ptr)->field_0x2c = (MVar14.ptr)->field_0x2c | 4;
    }
    else {
      MVar14.data = MVar14.data | 8;
    }
  }
  if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
     (self->dot_graph_file != (FILE *)0x0)) {
    if (((ulong)MVar14.ptr & 1) == 0) {
      uVar10 = (MVar14.ptr)->symbol;
    }
    else {
      uVar10 = (ushort)MVar14.data.symbol;
    }
    if (uVar10 == 0xffff) {
      pcVar20 = "ERROR";
    }
    else if (uVar10 == 0xfffe) {
      pcVar20 = "_ERROR";
    }
    else {
      pcVar20 = self->language->symbol_names[uVar10];
    }
    pTStack_130 = (TSParser *)0x13839d;
    snprintf((self->lexer).debug_buffer,0x400,"skip_token symbol:%s",pcVar20);
    pTStack_130 = (TSParser *)0x1383a5;
    ts_parser__log(self);
  }
  SVar35 = 8;
  pTStack_130 = (TSParser *)0x1383b4;
  pMVar19 = (MutableSubtree *)calloc(1,8);
  if (pMVar19 == (MutableSubtree *)0x0) {
    pTStack_130 = (TSParser *)0x1386d6;
    ts_parser__recover_cold_3();
LAB_001386d6:
    pTStack_130 = (TSParser *)0x1386de;
    ts_parser__recover_cold_1();
    pool = MVar14;
    pTVar32 = self;
    pTStack_140 = pTVar34;
LAB_001386de:
    pTStack_130 = (TSParser *)ts_parser__breakdown_top_of_stack;
    pTVar34 = pTStack_140;
    ts_parser__recover_cold_2();
    MStack_158 = pool;
    pSStack_150 = pSVar13;
    pTStack_148 = pTVar32;
    MStack_138 = MVar12;
    pTStack_130 = pTVar24;
    SVar37 = ts_stack_pop_pending(pTVar34->stack,SVar35);
    if (SVar37.size != 0) {
      do {
        pSVar13 = SVar37.contents;
        uVar18 = 0;
        pending = false;
        do {
          uVar11 = pSVar13[uVar18].version;
          if ((pTVar34->stack->heads).size <= uVar11) {
            __assert_fail("(uint32_t)version < (&self->heads)->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                          ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
          }
          uVar23 = pSVar13[uVar18].subtrees.size;
          uVar29 = (ulong)uVar23;
          if (uVar23 == 0) {
            __assert_fail("(uint32_t)0 < (&slice.subtrees)->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                          ,0x8d,"_Bool ts_parser__breakdown_top_of_stack(TSParser *, StackVersion)")
            ;
          }
          pSVar15 = pSVar13[uVar18].subtrees.contents;
          uVar10 = ((pTVar34->stack->heads).contents[uVar11].node)->state;
          SVar16 = (Subtree)pSVar15->ptr;
          if ((((ulong)SVar16.ptr & 1) == 0) &&
             (uVar17 = (SVar16.ptr)->child_count, (ulong)uVar17 != 0)) {
            uVar33 = 0;
            do {
              self_00 = (Subtree)((SVar16.ptr)->field_17).field_0.children[uVar33].ptr;
              if (((ulong)self_00.ptr & 1) == 0) {
                pending = (self_00.ptr)->child_count != 0;
                TVar9 = (self_00.ptr)->symbol;
                if (TVar9 != 0xffff) {
                  if (((self_00.ptr)->field_0x2c & 4) != 0) goto LAB_00138858;
                  if (TVar9 != 0xfffe) goto LAB_001387fe;
                }
                goto LAB_00138841;
              }
              if (((ulong)self_00.ptr & 8) == 0) {
                TVar9 = (TSSymbol)self_00.data.symbol;
                pending = false;
LAB_001387fe:
                self_01 = pTVar34->language;
                if ((uint)TVar9 < self_01->token_count) {
                  ts_language_table_entry(self_01,uVar10,TVar9,&TStack_168);
                  if (TStack_168.action_count != 0) {
                    uVar10 = TStack_168.actions[TStack_168.action_count - 1].params.field_0.state;
                    if (((TStack_168.actions[TStack_168.action_count - 1].field_0x6 & 0xf) == 0) ||
                       ((TStack_168.actions[TStack_168.action_count - 1].field_0x6 & 0xf) == 3))
                    goto LAB_00138858;
                  }
LAB_00138841:
                  uVar10 = 0;
                }
                else {
                  uVar10 = self_01->parse_table[(uint)uVar10 * self_01->symbol_count + (uint)TVar9];
                }
              }
              else {
                pending = false;
              }
LAB_00138858:
              ts_subtree_retain(self_00);
              ts_stack_push(pTVar34->stack,uVar11,self_00,pending,uVar10);
              uVar33 = uVar33 + 1;
            } while (uVar17 != uVar33);
          }
          if (uVar23 != 1) {
            if (uVar23 < 3) {
              uVar29 = 2;
            }
            uVar33 = 1;
            do {
              ts_stack_push(pTVar34->stack,uVar11,pSVar15[uVar33],false,uVar10);
              uVar33 = uVar33 + 1;
            } while (uVar29 != uVar33);
          }
          ts_subtree_release(&pTVar34->tree_pool,SVar16);
          free(pSVar15);
          if (((pTVar34->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (pTVar34->dot_graph_file != (FILE *)0x0)) {
            if (((ulong)SVar16.ptr & 1) == 0) {
              TVar9 = (SVar16.ptr)->symbol;
            }
            else {
              TVar9 = (TSSymbol)SVar16.data.symbol;
            }
            pcVar20 = "ERROR";
            if (TVar9 != 0xffff) {
              if (TVar9 == 0xfffe) {
                pcVar20 = "_ERROR";
              }
              else {
                pcVar20 = pTVar34->language->symbol_names[TVar9];
              }
            }
            snprintf((pTVar34->lexer).debug_buffer,0x400,"breakdown_top_of_stack tree:%s",pcVar20);
            ts_parser__log(pTVar34);
            if (pTVar34->dot_graph_file != (FILE *)0x0) {
              ts_stack_print_dot_graph(pTVar34->stack,pTVar34->language,pTVar34->dot_graph_file);
              fputs("\n\n",(FILE *)pTVar34->dot_graph_file);
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != (SVar37._8_8_ & 0xffffffff));
      } while ((pending) && (SVar37 = ts_stack_pop_pending(pTVar34->stack,SVar35), SVar37.size != 0)
              );
    }
    return;
  }
  local_108.action_count = 1;
  local_108.is_reusable = true;
  local_108._13_3_ = 0;
  pMVar19->ptr = (SubtreeHeapData *)MVar14;
  pool.ptr = (SubtreeHeapData *)&self->tree_pool;
  pTStack_130 = (TSParser *)0x1383f8;
  local_120.data = MVar14.data;
  local_108.actions = (TSParseAction *)pMVar19;
  MVar12 = ts_subtree_new_node((SubtreePool *)pool.ptr,0xfffe,(SubtreeArray *)&local_108,0,
                               self->language);
  if (local_ec == 0) goto LAB_001385fa;
  pTStack_130 = (TSParser *)0x13841a;
  SVar37 = ts_stack_pop_count(self->stack,uVar23,1);
  pSVar13 = SVar37.contents;
  if (((undefined1  [16])SVar37 & (undefined1  [16])0xfffffffe) == (undefined1  [16])0x0) {
    pSVar30 = self->stack;
    SVar35 = pSVar13->version;
  }
  else {
    lVar31 = (ulong)SVar37.size - 1;
    pSVar27 = pSVar13;
    do {
      pSVar27 = pSVar27 + 1;
      pTStack_130 = (TSParser *)0x13843d;
      ts_subtree_array_delete((SubtreePool *)pool.ptr,&pSVar27->subtrees);
      pTVar24 = local_110;
      lVar31 = lVar31 + -1;
    } while (lVar31 != 0);
    while( true ) {
      pSVar30 = pTVar24->stack;
      SVar35 = pSVar13->version;
      if ((pSVar30->heads).size <= SVar35 + 1) break;
      pTStack_130 = (TSParser *)0x138466;
      ts_stack_remove_version(pSVar30,SVar35 + 1);
    }
  }
  pTVar34 = (TSParser *)(ulong)local_124;
  pTStack_130 = (TSParser *)0x1384b5;
  ts_stack_renumber_version(pSVar30,SVar35,local_124);
  uVar11 = (pSVar13->subtrees).size;
  pTVar32 = (TSParser *)(ulong)uVar11;
  if (uVar11 == (pSVar13->subtrees).capacity) {
    pTVar24 = (TSParser *)&DAT_00000008;
    if (8 < uVar11 * 2) {
      pTVar24 = (TSParser *)(ulong)(uVar11 * 2);
    }
    pSVar15 = (pSVar13->subtrees).contents;
    if (uVar11 < (uint)pTVar24) {
      if (pSVar15 == (Subtree *)0x0) {
        SVar35 = 8;
        pTStack_130 = (TSParser *)0x1385b2;
        pSVar15 = (Subtree *)calloc((size_t)pTVar24,8);
        pTStack_140 = pTVar24;
        if (pSVar15 == (Subtree *)0x0) goto LAB_001386de;
      }
      else {
        pTVar34 = (TSParser *)((long)pTVar24 << 3);
        pTStack_130 = (TSParser *)0x1384fc;
        pTVar28 = pTVar34;
        pSVar15 = (Subtree *)realloc(pSVar15,(size_t)pTVar34);
        SVar35 = (StackVersion)pTVar28;
        MVar14 = pool;
        self = pTVar32;
        if (pSVar15 == (Subtree *)0x0) goto LAB_001386d6;
        pTVar32 = (TSParser *)(ulong)(pSVar13->subtrees).size;
      }
      (pSVar13->subtrees).contents = pSVar15;
      (pSVar13->subtrees).capacity = (uint)pTVar24;
      pTVar34 = (TSParser *)(ulong)local_124;
    }
  }
  else {
    pSVar15 = (pSVar13->subtrees).contents;
  }
  self = local_110;
  (pSVar13->subtrees).size = (int)pTVar32 + 1;
  *(MutableSubtree *)(pSVar15 + (long)pTVar32) = MVar12;
  pTStack_130 = (TSParser *)0x1385f7;
  MVar12 = ts_subtree_new_node((SubtreePool *)pool.ptr,0xfffe,&pSVar13->subtrees,0,
                               local_110->language);
LAB_001385fa:
  pTStack_130 = (TSParser *)0x138611;
  ts_stack_push(self->stack,(StackVersion)pTVar34,(Subtree)MVar12,false,0);
  if ((((ulong)local_120.ptr & 1) == 0) && (((local_120.ptr)->field_0x2c & 0x40) != 0)) {
    pSVar30 = self->stack;
    pTStack_130 = (TSParser *)0x13862e;
    SVar16 = ts_subtree_last_external_token(local_120);
    pTStack_130 = (TSParser *)0x13863c;
    ts_stack_set_last_external_token(pSVar30,(StackVersion)pTVar34,SVar16);
  }
  return;
}

Assistant:

static void ts_parser__recover(TSParser *self, StackVersion version, Subtree lookahead) {
  bool did_recover = false;
  unsigned previous_version_count = ts_stack_version_count(self->stack);
  Length position = ts_stack_position(self->stack, version);
  StackSummary *summary = ts_stack_get_summary(self->stack, version);
  unsigned node_count_since_error = ts_stack_node_count_since_error(self->stack, version);
  unsigned current_error_cost = ts_stack_error_cost(self->stack, version);

  // When the parser is in the error state, there are two strategies for recovering with a
  // given lookahead token:
  // 1. Find a previous state on the stack in which that lookahead token would be valid. Then,
  //    create a new stack version that is in that state again. This entails popping all of the
  //    subtrees that have been pushed onto the stack since that previous state, and wrapping
  //    them in an ERROR node.
  // 2. Wrap the lookahead token in an ERROR node, push that ERROR node onto the stack, and
  //    move on to the next lookahead token, remaining in the error state.
  //
  // First, try the strategy 1. Upon entering the error state, the parser recorded a summary
  // of the previous parse states and their depths. Look at each state in the summary, to see
  // if the current lookahead token would be valid in that state.
  if (summary && !ts_subtree_is_error(lookahead)) {
    for (unsigned i = 0; i < summary->size; i++) {
      StackSummaryEntry entry = summary->contents[i];

      if (entry.state == ERROR_STATE) continue;
      if (entry.position.bytes == position.bytes) continue;
      unsigned depth = entry.depth;
      if (node_count_since_error > 0) depth++;

      // Do not recover in ways that create redundant stack versions.
      bool would_merge = false;
      for (unsigned j = 0; j < previous_version_count; j++) {
        if (
          ts_stack_state(self->stack, j) == entry.state &&
          ts_stack_position(self->stack, j).bytes == position.bytes
        ) {
          would_merge = true;
          break;
        }
      }
      if (would_merge) continue;

      // Do not recover if the result would clearly be worse than some existing stack version.
      unsigned new_cost =
        current_error_cost +
        entry.depth * ERROR_COST_PER_SKIPPED_TREE +
        (position.bytes - entry.position.bytes) * ERROR_COST_PER_SKIPPED_CHAR +
        (position.extent.row - entry.position.extent.row) * ERROR_COST_PER_SKIPPED_LINE;
      if (ts_parser__better_version_exists(self, version, false, new_cost)) break;

      // If the current lookahead token is valid in some previous state, recover to that state.
      // Then stop looking for further recoveries.
      if (ts_language_has_actions(self->language, entry.state, ts_subtree_symbol(lookahead))) {
        if (ts_parser__recover_to_state(self, version, depth, entry.state)) {
          did_recover = true;
          LOG("recover_to_previous state:%u, depth:%u", entry.state, depth);
          LOG_STACK();
          break;
        }
      }
    }
  }

  // In the process of attemping to recover, some stack versions may have been created
  // and subsequently halted. Remove those versions.
  for (unsigned i = previous_version_count; i < ts_stack_version_count(self->stack); i++) {
    if (!ts_stack_is_active(self->stack, i)) {
      ts_stack_remove_version(self->stack, i--);
    }
  }

  // If strategy 1 succeeded, a new stack version will have been created which is able to handle
  // the current lookahead token. Now, in addition, try strategy 2 described above: skip the
  // current lookahead token by wrapping it in an ERROR node.

  // Don't pursue this additional strategy if there are already too many stack versions.
  if (did_recover && ts_stack_version_count(self->stack) > MAX_VERSION_COUNT) {
    ts_stack_halt(self->stack, version);
    ts_subtree_release(&self->tree_pool, lookahead);
    return;
  }

  // If the parser is still in the error state at the end of the file, just wrap everything
  // in an ERROR node and terminate.
  if (ts_subtree_is_eof(lookahead)) {
    LOG("recover_eof");
    SubtreeArray children = array_new();
    Subtree parent = ts_subtree_new_error_node(&self->tree_pool, &children, false, self->language);
    ts_stack_push(self->stack, version, parent, false, 1);
    ts_parser__accept(self, version, lookahead);
    return;
  }

  // Do not recover if the result would clearly be worse than some existing stack version.
  unsigned new_cost =
    current_error_cost + ERROR_COST_PER_SKIPPED_TREE +
    ts_subtree_total_bytes(lookahead) * ERROR_COST_PER_SKIPPED_CHAR +
    ts_subtree_total_size(lookahead).extent.row * ERROR_COST_PER_SKIPPED_LINE;
  if (ts_parser__better_version_exists(self, version, false, new_cost)) {
    ts_stack_halt(self->stack, version);
    ts_subtree_release(&self->tree_pool, lookahead);
    return;
  }

  // If the current lookahead token is an extra token, mark it as extra. This means it won't
  // be counted in error cost calculations.
  unsigned n;
  const TSParseAction *actions = ts_language_actions(self->language, 1, ts_subtree_symbol(lookahead), &n);
  if (n > 0 && actions[n - 1].type == TSParseActionTypeShift && actions[n - 1].params.extra) {
    MutableSubtree mutable_lookahead = ts_subtree_make_mut(&self->tree_pool, lookahead);
    ts_subtree_set_extra(&mutable_lookahead);
    lookahead = ts_subtree_from_mut(mutable_lookahead);
  }

  // Wrap the lookahead token in an ERROR.
  LOG("skip_token symbol:%s", TREE_NAME(lookahead));
  SubtreeArray children = array_new();
  array_reserve(&children, 1);
  array_push(&children, lookahead);
  MutableSubtree error_repeat = ts_subtree_new_node(
    &self->tree_pool,
    ts_builtin_sym_error_repeat,
    &children,
    0,
    self->language
  );

  // If other tokens have already been skipped, so there is already an ERROR at the top of the
  // stack, then pop that ERROR off the stack and wrap the two ERRORs together into one larger
  // ERROR.
  if (node_count_since_error > 0) {
    StackSliceArray pop = ts_stack_pop_count(self->stack, version, 1);

    // TODO: Figure out how to make this condition occur.
    // See https://github.com/atom/atom/issues/18450#issuecomment-439579778
    // If multiple stack versions have merged at this point, just pick one of the errors
    // arbitrarily and discard the rest.
    if (pop.size > 1) {
      for (unsigned i = 1; i < pop.size; i++) {
        ts_subtree_array_delete(&self->tree_pool, &pop.contents[i].subtrees);
      }
      while (ts_stack_version_count(self->stack) > pop.contents[0].version + 1) {
        ts_stack_remove_version(self->stack, pop.contents[0].version + 1);
      }
    }

    ts_stack_renumber_version(self->stack, pop.contents[0].version, version);
    array_push(&pop.contents[0].subtrees, ts_subtree_from_mut(error_repeat));
    error_repeat = ts_subtree_new_node(
      &self->tree_pool,
      ts_builtin_sym_error_repeat,
      &pop.contents[0].subtrees,
      0,
      self->language
    );
  }

  // Push the new ERROR onto the stack.
  ts_stack_push(self->stack, version, ts_subtree_from_mut(error_repeat), false, ERROR_STATE);
  if (ts_subtree_has_external_tokens(lookahead)) {
    ts_stack_set_last_external_token(
      self->stack, version, ts_subtree_last_external_token(lookahead)
    );
  }
}